

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O3

void slang::syntax::detail::
     visitSyntaxNode<slang::syntax::SyntaxNode,slang::ast::ParameterSymbolBase::checkDefaultExpression()const::Visitor>
               (SyntaxNode *node,Visitor *visitor)

{
  (*(code *)(&DAT_00512ba4 + *(int *)(&DAT_00512ba4 + (ulong)node->kind * 4)))
            (node,visitor,&DAT_00512ba4 + *(int *)(&DAT_00512ba4 + (ulong)node->kind * 4));
  return;
}

Assistant:

decltype(auto) visitSyntaxNode(TNode* node, TVisitor& visitor, Args&&... args) {
    static constexpr bool isConst = std::is_const_v<TNode>;    switch (node->kind) {
        case SyntaxKind::Unknown: return visitor.visit(*static_cast<std::conditional_t<isConst, const InvalidSyntaxNode*, InvalidSyntaxNode*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::SyntaxList:
        case SyntaxKind::TokenList:
        case SyntaxKind::SeparatedList:
            return visitor.visit(*static_cast<std::conditional_t<isConst, const SyntaxListBase*, SyntaxListBase*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::AcceptOnPropertyExpr: return visitor.visit(*static_cast<std::conditional_t<isConst, const AcceptOnPropertyExprSyntax*, AcceptOnPropertyExprSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ActionBlock: return visitor.visit(*static_cast<std::conditional_t<isConst, const ActionBlockSyntax*, ActionBlockSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::AddAssignmentExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::AddExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::AlwaysBlock: return visitor.visit(*static_cast<std::conditional_t<isConst, const ProceduralBlockSyntax*, ProceduralBlockSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::AlwaysCombBlock: return visitor.visit(*static_cast<std::conditional_t<isConst, const ProceduralBlockSyntax*, ProceduralBlockSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::AlwaysFFBlock: return visitor.visit(*static_cast<std::conditional_t<isConst, const ProceduralBlockSyntax*, ProceduralBlockSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::AlwaysLatchBlock: return visitor.visit(*static_cast<std::conditional_t<isConst, const ProceduralBlockSyntax*, ProceduralBlockSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::AndAssignmentExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::AndPropertyExpr: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryPropertyExprSyntax*, BinaryPropertyExprSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::AndSequenceExpr: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinarySequenceExprSyntax*, BinarySequenceExprSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::AnonymousProgram: return visitor.visit(*static_cast<std::conditional_t<isConst, const AnonymousProgramSyntax*, AnonymousProgramSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::AnsiPortList: return visitor.visit(*static_cast<std::conditional_t<isConst, const AnsiPortListSyntax*, AnsiPortListSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::AnsiUdpPortList: return visitor.visit(*static_cast<std::conditional_t<isConst, const AnsiUdpPortListSyntax*, AnsiUdpPortListSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ArgumentList: return visitor.visit(*static_cast<std::conditional_t<isConst, const ArgumentListSyntax*, ArgumentListSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ArithmeticLeftShiftAssignmentExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ArithmeticRightShiftAssignmentExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ArithmeticShiftLeftExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ArithmeticShiftRightExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ArrayAndMethod: return visitor.visit(*static_cast<std::conditional_t<isConst, const KeywordNameSyntax*, KeywordNameSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ArrayOrMethod: return visitor.visit(*static_cast<std::conditional_t<isConst, const KeywordNameSyntax*, KeywordNameSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ArrayOrRandomizeMethodExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const ArrayOrRandomizeMethodExpressionSyntax*, ArrayOrRandomizeMethodExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ArrayUniqueMethod: return visitor.visit(*static_cast<std::conditional_t<isConst, const KeywordNameSyntax*, KeywordNameSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ArrayXorMethod: return visitor.visit(*static_cast<std::conditional_t<isConst, const KeywordNameSyntax*, KeywordNameSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::AscendingRangeSelect: return visitor.visit(*static_cast<std::conditional_t<isConst, const RangeSelectSyntax*, RangeSelectSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::AssertPropertyStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const ConcurrentAssertionStatementSyntax*, ConcurrentAssertionStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::AssertionItemPort: return visitor.visit(*static_cast<std::conditional_t<isConst, const AssertionItemPortSyntax*, AssertionItemPortSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::AssertionItemPortList: return visitor.visit(*static_cast<std::conditional_t<isConst, const AssertionItemPortListSyntax*, AssertionItemPortListSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::AssignmentExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::AssignmentPatternExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const AssignmentPatternExpressionSyntax*, AssignmentPatternExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::AssignmentPatternItem: return visitor.visit(*static_cast<std::conditional_t<isConst, const AssignmentPatternItemSyntax*, AssignmentPatternItemSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::AssumePropertyStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const ConcurrentAssertionStatementSyntax*, ConcurrentAssertionStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::AttributeInstance: return visitor.visit(*static_cast<std::conditional_t<isConst, const AttributeInstanceSyntax*, AttributeInstanceSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::AttributeSpec: return visitor.visit(*static_cast<std::conditional_t<isConst, const AttributeSpecSyntax*, AttributeSpecSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::BadExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BadExpressionSyntax*, BadExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::BeginKeywordsDirective: return visitor.visit(*static_cast<std::conditional_t<isConst, const BeginKeywordsDirectiveSyntax*, BeginKeywordsDirectiveSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::BinSelectWithFilterExpr: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinSelectWithFilterExprSyntax*, BinSelectWithFilterExprSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::BinaryAndExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::BinaryBinsSelectExpr: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryBinsSelectExprSyntax*, BinaryBinsSelectExprSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::BinaryBlockEventExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryBlockEventExpressionSyntax*, BinaryBlockEventExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::BinaryConditionalDirectiveExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryConditionalDirectiveExpressionSyntax*, BinaryConditionalDirectiveExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::BinaryEventExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryEventExpressionSyntax*, BinaryEventExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::BinaryOrExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::BinaryXnorExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::BinaryXorExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::BindDirective: return visitor.visit(*static_cast<std::conditional_t<isConst, const BindDirectiveSyntax*, BindDirectiveSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::BindTargetList: return visitor.visit(*static_cast<std::conditional_t<isConst, const BindTargetListSyntax*, BindTargetListSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::BinsSelectConditionExpr: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinsSelectConditionExprSyntax*, BinsSelectConditionExprSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::BinsSelection: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinsSelectionSyntax*, BinsSelectionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::BitSelect: return visitor.visit(*static_cast<std::conditional_t<isConst, const BitSelectSyntax*, BitSelectSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::BitType: return visitor.visit(*static_cast<std::conditional_t<isConst, const IntegerTypeSyntax*, IntegerTypeSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::BlockCoverageEvent: return visitor.visit(*static_cast<std::conditional_t<isConst, const BlockCoverageEventSyntax*, BlockCoverageEventSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::BlockingEventTriggerStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const EventTriggerStatementSyntax*, EventTriggerStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ByteType: return visitor.visit(*static_cast<std::conditional_t<isConst, const IntegerTypeSyntax*, IntegerTypeSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::CHandleType: return visitor.visit(*static_cast<std::conditional_t<isConst, const KeywordTypeSyntax*, KeywordTypeSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::CaseEqualityExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::CaseGenerate: return visitor.visit(*static_cast<std::conditional_t<isConst, const CaseGenerateSyntax*, CaseGenerateSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::CaseInequalityExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::CasePropertyExpr: return visitor.visit(*static_cast<std::conditional_t<isConst, const CasePropertyExprSyntax*, CasePropertyExprSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::CaseStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const CaseStatementSyntax*, CaseStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::CastExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const CastExpressionSyntax*, CastExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::CellConfigRule: return visitor.visit(*static_cast<std::conditional_t<isConst, const CellConfigRuleSyntax*, CellConfigRuleSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::CellDefineDirective: return visitor.visit(*static_cast<std::conditional_t<isConst, const SimpleDirectiveSyntax*, SimpleDirectiveSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ChargeStrength: return visitor.visit(*static_cast<std::conditional_t<isConst, const ChargeStrengthSyntax*, ChargeStrengthSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::CheckerDataDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const CheckerDataDeclarationSyntax*, CheckerDataDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::CheckerDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const CheckerDeclarationSyntax*, CheckerDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::CheckerInstanceStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const CheckerInstanceStatementSyntax*, CheckerInstanceStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::CheckerInstantiation: return visitor.visit(*static_cast<std::conditional_t<isConst, const CheckerInstantiationSyntax*, CheckerInstantiationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ClassDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const ClassDeclarationSyntax*, ClassDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ClassMethodDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const ClassMethodDeclarationSyntax*, ClassMethodDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ClassMethodPrototype: return visitor.visit(*static_cast<std::conditional_t<isConst, const ClassMethodPrototypeSyntax*, ClassMethodPrototypeSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ClassName: return visitor.visit(*static_cast<std::conditional_t<isConst, const ClassNameSyntax*, ClassNameSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ClassPropertyDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const ClassPropertyDeclarationSyntax*, ClassPropertyDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ClassSpecifier: return visitor.visit(*static_cast<std::conditional_t<isConst, const ClassSpecifierSyntax*, ClassSpecifierSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ClockingDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const ClockingDeclarationSyntax*, ClockingDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ClockingDirection: return visitor.visit(*static_cast<std::conditional_t<isConst, const ClockingDirectionSyntax*, ClockingDirectionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ClockingItem: return visitor.visit(*static_cast<std::conditional_t<isConst, const ClockingItemSyntax*, ClockingItemSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ClockingPropertyExpr: return visitor.visit(*static_cast<std::conditional_t<isConst, const ClockingPropertyExprSyntax*, ClockingPropertyExprSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ClockingSequenceExpr: return visitor.visit(*static_cast<std::conditional_t<isConst, const ClockingSequenceExprSyntax*, ClockingSequenceExprSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ClockingSkew: return visitor.visit(*static_cast<std::conditional_t<isConst, const ClockingSkewSyntax*, ClockingSkewSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ColonExpressionClause: return visitor.visit(*static_cast<std::conditional_t<isConst, const ColonExpressionClauseSyntax*, ColonExpressionClauseSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::CompilationUnit: return visitor.visit(*static_cast<std::conditional_t<isConst, const CompilationUnitSyntax*, CompilationUnitSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ConcatenationExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const ConcatenationExpressionSyntax*, ConcatenationExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ConcurrentAssertionMember: return visitor.visit(*static_cast<std::conditional_t<isConst, const ConcurrentAssertionMemberSyntax*, ConcurrentAssertionMemberSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ConditionalConstraint: return visitor.visit(*static_cast<std::conditional_t<isConst, const ConditionalConstraintSyntax*, ConditionalConstraintSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ConditionalExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const ConditionalExpressionSyntax*, ConditionalExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ConditionalPathDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const ConditionalPathDeclarationSyntax*, ConditionalPathDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ConditionalPattern: return visitor.visit(*static_cast<std::conditional_t<isConst, const ConditionalPatternSyntax*, ConditionalPatternSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ConditionalPredicate: return visitor.visit(*static_cast<std::conditional_t<isConst, const ConditionalPredicateSyntax*, ConditionalPredicateSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ConditionalPropertyExpr: return visitor.visit(*static_cast<std::conditional_t<isConst, const ConditionalPropertyExprSyntax*, ConditionalPropertyExprSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ConditionalStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const ConditionalStatementSyntax*, ConditionalStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ConfigCellIdentifier: return visitor.visit(*static_cast<std::conditional_t<isConst, const ConfigCellIdentifierSyntax*, ConfigCellIdentifierSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ConfigDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const ConfigDeclarationSyntax*, ConfigDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ConfigInstanceIdentifier: return visitor.visit(*static_cast<std::conditional_t<isConst, const ConfigInstanceIdentifierSyntax*, ConfigInstanceIdentifierSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ConfigLiblist: return visitor.visit(*static_cast<std::conditional_t<isConst, const ConfigLiblistSyntax*, ConfigLiblistSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ConfigUseClause: return visitor.visit(*static_cast<std::conditional_t<isConst, const ConfigUseClauseSyntax*, ConfigUseClauseSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ConstraintBlock: return visitor.visit(*static_cast<std::conditional_t<isConst, const ConstraintBlockSyntax*, ConstraintBlockSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ConstraintDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const ConstraintDeclarationSyntax*, ConstraintDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ConstraintPrototype: return visitor.visit(*static_cast<std::conditional_t<isConst, const ConstraintPrototypeSyntax*, ConstraintPrototypeSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ConstructorName: return visitor.visit(*static_cast<std::conditional_t<isConst, const KeywordNameSyntax*, KeywordNameSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ContinuousAssign: return visitor.visit(*static_cast<std::conditional_t<isConst, const ContinuousAssignSyntax*, ContinuousAssignSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::CopyClassExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const CopyClassExpressionSyntax*, CopyClassExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::CoverCross: return visitor.visit(*static_cast<std::conditional_t<isConst, const CoverCrossSyntax*, CoverCrossSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::CoverPropertyStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const ConcurrentAssertionStatementSyntax*, ConcurrentAssertionStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::CoverSequenceStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const ConcurrentAssertionStatementSyntax*, ConcurrentAssertionStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::CoverageBins: return visitor.visit(*static_cast<std::conditional_t<isConst, const CoverageBinsSyntax*, CoverageBinsSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::CoverageBinsArraySize: return visitor.visit(*static_cast<std::conditional_t<isConst, const CoverageBinsArraySizeSyntax*, CoverageBinsArraySizeSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::CoverageIffClause: return visitor.visit(*static_cast<std::conditional_t<isConst, const CoverageIffClauseSyntax*, CoverageIffClauseSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::CoverageOption: return visitor.visit(*static_cast<std::conditional_t<isConst, const CoverageOptionSyntax*, CoverageOptionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::CovergroupDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const CovergroupDeclarationSyntax*, CovergroupDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::Coverpoint: return visitor.visit(*static_cast<std::conditional_t<isConst, const CoverpointSyntax*, CoverpointSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::CycleDelay: return visitor.visit(*static_cast<std::conditional_t<isConst, const DelaySyntax*, DelaySyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DPIExport: return visitor.visit(*static_cast<std::conditional_t<isConst, const DPIExportSyntax*, DPIExportSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DPIImport: return visitor.visit(*static_cast<std::conditional_t<isConst, const DPIImportSyntax*, DPIImportSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DataDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const DataDeclarationSyntax*, DataDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::Declarator: return visitor.visit(*static_cast<std::conditional_t<isConst, const DeclaratorSyntax*, DeclaratorSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DefParam: return visitor.visit(*static_cast<std::conditional_t<isConst, const DefParamSyntax*, DefParamSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DefParamAssignment: return visitor.visit(*static_cast<std::conditional_t<isConst, const DefParamAssignmentSyntax*, DefParamAssignmentSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DefaultCaseItem: return visitor.visit(*static_cast<std::conditional_t<isConst, const DefaultCaseItemSyntax*, DefaultCaseItemSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DefaultClockingReference: return visitor.visit(*static_cast<std::conditional_t<isConst, const DefaultClockingReferenceSyntax*, DefaultClockingReferenceSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DefaultConfigRule: return visitor.visit(*static_cast<std::conditional_t<isConst, const DefaultConfigRuleSyntax*, DefaultConfigRuleSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DefaultCoverageBinInitializer: return visitor.visit(*static_cast<std::conditional_t<isConst, const DefaultCoverageBinInitializerSyntax*, DefaultCoverageBinInitializerSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DefaultDecayTimeDirective: return visitor.visit(*static_cast<std::conditional_t<isConst, const DefaultDecayTimeDirectiveSyntax*, DefaultDecayTimeDirectiveSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DefaultDisableDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const DefaultDisableDeclarationSyntax*, DefaultDisableDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DefaultDistItem: return visitor.visit(*static_cast<std::conditional_t<isConst, const DefaultDistItemSyntax*, DefaultDistItemSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DefaultExtendsClauseArg: return visitor.visit(*static_cast<std::conditional_t<isConst, const DefaultExtendsClauseArgSyntax*, DefaultExtendsClauseArgSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DefaultFunctionPort: return visitor.visit(*static_cast<std::conditional_t<isConst, const DefaultFunctionPortSyntax*, DefaultFunctionPortSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DefaultNetTypeDirective: return visitor.visit(*static_cast<std::conditional_t<isConst, const DefaultNetTypeDirectiveSyntax*, DefaultNetTypeDirectiveSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DefaultPatternKeyExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const LiteralExpressionSyntax*, LiteralExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DefaultPropertyCaseItem: return visitor.visit(*static_cast<std::conditional_t<isConst, const DefaultPropertyCaseItemSyntax*, DefaultPropertyCaseItemSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DefaultRsCaseItem: return visitor.visit(*static_cast<std::conditional_t<isConst, const DefaultRsCaseItemSyntax*, DefaultRsCaseItemSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DefaultSkewItem: return visitor.visit(*static_cast<std::conditional_t<isConst, const DefaultSkewItemSyntax*, DefaultSkewItemSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DefaultTriregStrengthDirective: return visitor.visit(*static_cast<std::conditional_t<isConst, const DefaultTriregStrengthDirectiveSyntax*, DefaultTriregStrengthDirectiveSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DeferredAssertion: return visitor.visit(*static_cast<std::conditional_t<isConst, const DeferredAssertionSyntax*, DeferredAssertionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DefineDirective: return visitor.visit(*static_cast<std::conditional_t<isConst, const DefineDirectiveSyntax*, DefineDirectiveSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::Delay3: return visitor.visit(*static_cast<std::conditional_t<isConst, const Delay3Syntax*, Delay3Syntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DelayControl: return visitor.visit(*static_cast<std::conditional_t<isConst, const DelaySyntax*, DelaySyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DelayModeDistributedDirective: return visitor.visit(*static_cast<std::conditional_t<isConst, const SimpleDirectiveSyntax*, SimpleDirectiveSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DelayModePathDirective: return visitor.visit(*static_cast<std::conditional_t<isConst, const SimpleDirectiveSyntax*, SimpleDirectiveSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DelayModeUnitDirective: return visitor.visit(*static_cast<std::conditional_t<isConst, const SimpleDirectiveSyntax*, SimpleDirectiveSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DelayModeZeroDirective: return visitor.visit(*static_cast<std::conditional_t<isConst, const SimpleDirectiveSyntax*, SimpleDirectiveSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DelayedSequenceElement: return visitor.visit(*static_cast<std::conditional_t<isConst, const DelayedSequenceElementSyntax*, DelayedSequenceElementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DelayedSequenceExpr: return visitor.visit(*static_cast<std::conditional_t<isConst, const DelayedSequenceExprSyntax*, DelayedSequenceExprSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DescendingRangeSelect: return visitor.visit(*static_cast<std::conditional_t<isConst, const RangeSelectSyntax*, RangeSelectSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DisableConstraint: return visitor.visit(*static_cast<std::conditional_t<isConst, const DisableConstraintSyntax*, DisableConstraintSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DisableForkStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const DisableForkStatementSyntax*, DisableForkStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DisableIff: return visitor.visit(*static_cast<std::conditional_t<isConst, const DisableIffSyntax*, DisableIffSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DisableStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const DisableStatementSyntax*, DisableStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DistConstraintList: return visitor.visit(*static_cast<std::conditional_t<isConst, const DistConstraintListSyntax*, DistConstraintListSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DistItem: return visitor.visit(*static_cast<std::conditional_t<isConst, const DistItemSyntax*, DistItemSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DistWeight: return visitor.visit(*static_cast<std::conditional_t<isConst, const DistWeightSyntax*, DistWeightSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DivideAssignmentExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DivideExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DividerClause: return visitor.visit(*static_cast<std::conditional_t<isConst, const DividerClauseSyntax*, DividerClauseSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DoWhileStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const DoWhileStatementSyntax*, DoWhileStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DotMemberClause: return visitor.visit(*static_cast<std::conditional_t<isConst, const DotMemberClauseSyntax*, DotMemberClauseSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::DriveStrength: return visitor.visit(*static_cast<std::conditional_t<isConst, const DriveStrengthSyntax*, DriveStrengthSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::EdgeControlSpecifier: return visitor.visit(*static_cast<std::conditional_t<isConst, const EdgeControlSpecifierSyntax*, EdgeControlSpecifierSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::EdgeDescriptor: return visitor.visit(*static_cast<std::conditional_t<isConst, const EdgeDescriptorSyntax*, EdgeDescriptorSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::EdgeSensitivePathSuffix: return visitor.visit(*static_cast<std::conditional_t<isConst, const EdgeSensitivePathSuffixSyntax*, EdgeSensitivePathSuffixSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ElabSystemTask: return visitor.visit(*static_cast<std::conditional_t<isConst, const ElabSystemTaskSyntax*, ElabSystemTaskSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ElementSelect: return visitor.visit(*static_cast<std::conditional_t<isConst, const ElementSelectSyntax*, ElementSelectSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ElementSelectExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const ElementSelectExpressionSyntax*, ElementSelectExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ElsIfDirective: return visitor.visit(*static_cast<std::conditional_t<isConst, const ConditionalBranchDirectiveSyntax*, ConditionalBranchDirectiveSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ElseClause: return visitor.visit(*static_cast<std::conditional_t<isConst, const ElseClauseSyntax*, ElseClauseSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ElseConstraintClause: return visitor.visit(*static_cast<std::conditional_t<isConst, const ElseConstraintClauseSyntax*, ElseConstraintClauseSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ElseDirective: return visitor.visit(*static_cast<std::conditional_t<isConst, const UnconditionalBranchDirectiveSyntax*, UnconditionalBranchDirectiveSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ElsePropertyClause: return visitor.visit(*static_cast<std::conditional_t<isConst, const ElsePropertyClauseSyntax*, ElsePropertyClauseSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::EmptyArgument: return visitor.visit(*static_cast<std::conditional_t<isConst, const EmptyArgumentSyntax*, EmptyArgumentSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::EmptyIdentifierName: return visitor.visit(*static_cast<std::conditional_t<isConst, const EmptyIdentifierNameSyntax*, EmptyIdentifierNameSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::EmptyMember: return visitor.visit(*static_cast<std::conditional_t<isConst, const EmptyMemberSyntax*, EmptyMemberSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::EmptyNonAnsiPort: return visitor.visit(*static_cast<std::conditional_t<isConst, const EmptyNonAnsiPortSyntax*, EmptyNonAnsiPortSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::EmptyPortConnection: return visitor.visit(*static_cast<std::conditional_t<isConst, const EmptyPortConnectionSyntax*, EmptyPortConnectionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::EmptyQueueExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const EmptyQueueExpressionSyntax*, EmptyQueueExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::EmptyStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const EmptyStatementSyntax*, EmptyStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::EmptyTimingCheckArg: return visitor.visit(*static_cast<std::conditional_t<isConst, const EmptyTimingCheckArgSyntax*, EmptyTimingCheckArgSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::EndCellDefineDirective: return visitor.visit(*static_cast<std::conditional_t<isConst, const SimpleDirectiveSyntax*, SimpleDirectiveSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::EndIfDirective: return visitor.visit(*static_cast<std::conditional_t<isConst, const UnconditionalBranchDirectiveSyntax*, UnconditionalBranchDirectiveSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::EndKeywordsDirective: return visitor.visit(*static_cast<std::conditional_t<isConst, const SimpleDirectiveSyntax*, SimpleDirectiveSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::EndProtectDirective: return visitor.visit(*static_cast<std::conditional_t<isConst, const SimpleDirectiveSyntax*, SimpleDirectiveSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::EndProtectedDirective: return visitor.visit(*static_cast<std::conditional_t<isConst, const SimpleDirectiveSyntax*, SimpleDirectiveSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::EnumType: return visitor.visit(*static_cast<std::conditional_t<isConst, const EnumTypeSyntax*, EnumTypeSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::EqualityExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::EqualsAssertionArgClause: return visitor.visit(*static_cast<std::conditional_t<isConst, const EqualsAssertionArgClauseSyntax*, EqualsAssertionArgClauseSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::EqualsTypeClause: return visitor.visit(*static_cast<std::conditional_t<isConst, const EqualsTypeClauseSyntax*, EqualsTypeClauseSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::EqualsValueClause: return visitor.visit(*static_cast<std::conditional_t<isConst, const EqualsValueClauseSyntax*, EqualsValueClauseSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::EventControl: return visitor.visit(*static_cast<std::conditional_t<isConst, const EventControlSyntax*, EventControlSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::EventControlWithExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const EventControlWithExpressionSyntax*, EventControlWithExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::EventType: return visitor.visit(*static_cast<std::conditional_t<isConst, const KeywordTypeSyntax*, KeywordTypeSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ExpectPropertyStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const ConcurrentAssertionStatementSyntax*, ConcurrentAssertionStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ExplicitAnsiPort: return visitor.visit(*static_cast<std::conditional_t<isConst, const ExplicitAnsiPortSyntax*, ExplicitAnsiPortSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ExplicitNonAnsiPort: return visitor.visit(*static_cast<std::conditional_t<isConst, const ExplicitNonAnsiPortSyntax*, ExplicitNonAnsiPortSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ExpressionConstraint: return visitor.visit(*static_cast<std::conditional_t<isConst, const ExpressionConstraintSyntax*, ExpressionConstraintSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ExpressionCoverageBinInitializer: return visitor.visit(*static_cast<std::conditional_t<isConst, const ExpressionCoverageBinInitializerSyntax*, ExpressionCoverageBinInitializerSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ExpressionOrDist: return visitor.visit(*static_cast<std::conditional_t<isConst, const ExpressionOrDistSyntax*, ExpressionOrDistSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ExpressionPattern: return visitor.visit(*static_cast<std::conditional_t<isConst, const ExpressionPatternSyntax*, ExpressionPatternSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ExpressionStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const ExpressionStatementSyntax*, ExpressionStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ExpressionTimingCheckArg: return visitor.visit(*static_cast<std::conditional_t<isConst, const ExpressionTimingCheckArgSyntax*, ExpressionTimingCheckArgSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ExtendsClause: return visitor.visit(*static_cast<std::conditional_t<isConst, const ExtendsClauseSyntax*, ExtendsClauseSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ExternInterfaceMethod: return visitor.visit(*static_cast<std::conditional_t<isConst, const ExternInterfaceMethodSyntax*, ExternInterfaceMethodSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ExternModuleDecl: return visitor.visit(*static_cast<std::conditional_t<isConst, const ExternModuleDeclSyntax*, ExternModuleDeclSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ExternUdpDecl: return visitor.visit(*static_cast<std::conditional_t<isConst, const ExternUdpDeclSyntax*, ExternUdpDeclSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::FilePathSpec: return visitor.visit(*static_cast<std::conditional_t<isConst, const FilePathSpecSyntax*, FilePathSpecSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::FinalBlock: return visitor.visit(*static_cast<std::conditional_t<isConst, const ProceduralBlockSyntax*, ProceduralBlockSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::FirstMatchSequenceExpr: return visitor.visit(*static_cast<std::conditional_t<isConst, const FirstMatchSequenceExprSyntax*, FirstMatchSequenceExprSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::FollowedByPropertyExpr: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryPropertyExprSyntax*, BinaryPropertyExprSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ForLoopStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const ForLoopStatementSyntax*, ForLoopStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ForVariableDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const ForVariableDeclarationSyntax*, ForVariableDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ForeachLoopList: return visitor.visit(*static_cast<std::conditional_t<isConst, const ForeachLoopListSyntax*, ForeachLoopListSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ForeachLoopStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const ForeachLoopStatementSyntax*, ForeachLoopStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ForeverStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const ForeverStatementSyntax*, ForeverStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ForwardTypeRestriction: return visitor.visit(*static_cast<std::conditional_t<isConst, const ForwardTypeRestrictionSyntax*, ForwardTypeRestrictionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ForwardTypedefDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const ForwardTypedefDeclarationSyntax*, ForwardTypedefDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::FunctionDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const FunctionDeclarationSyntax*, FunctionDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::FunctionPort: return visitor.visit(*static_cast<std::conditional_t<isConst, const FunctionPortSyntax*, FunctionPortSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::FunctionPortList: return visitor.visit(*static_cast<std::conditional_t<isConst, const FunctionPortListSyntax*, FunctionPortListSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::FunctionPrototype: return visitor.visit(*static_cast<std::conditional_t<isConst, const FunctionPrototypeSyntax*, FunctionPrototypeSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::GenerateBlock: return visitor.visit(*static_cast<std::conditional_t<isConst, const GenerateBlockSyntax*, GenerateBlockSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::GenerateRegion: return visitor.visit(*static_cast<std::conditional_t<isConst, const GenerateRegionSyntax*, GenerateRegionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::GenvarDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const GenvarDeclarationSyntax*, GenvarDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::GreaterThanEqualExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::GreaterThanExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::HierarchicalInstance: return visitor.visit(*static_cast<std::conditional_t<isConst, const HierarchicalInstanceSyntax*, HierarchicalInstanceSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::HierarchyInstantiation: return visitor.visit(*static_cast<std::conditional_t<isConst, const HierarchyInstantiationSyntax*, HierarchyInstantiationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::IdWithExprCoverageBinInitializer: return visitor.visit(*static_cast<std::conditional_t<isConst, const IdWithExprCoverageBinInitializerSyntax*, IdWithExprCoverageBinInitializerSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::IdentifierName: return visitor.visit(*static_cast<std::conditional_t<isConst, const IdentifierNameSyntax*, IdentifierNameSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::IdentifierSelectName: return visitor.visit(*static_cast<std::conditional_t<isConst, const IdentifierSelectNameSyntax*, IdentifierSelectNameSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::IfDefDirective: return visitor.visit(*static_cast<std::conditional_t<isConst, const ConditionalBranchDirectiveSyntax*, ConditionalBranchDirectiveSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::IfGenerate: return visitor.visit(*static_cast<std::conditional_t<isConst, const IfGenerateSyntax*, IfGenerateSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::IfNDefDirective: return visitor.visit(*static_cast<std::conditional_t<isConst, const ConditionalBranchDirectiveSyntax*, ConditionalBranchDirectiveSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::IfNonePathDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const IfNonePathDeclarationSyntax*, IfNonePathDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::IffEventClause: return visitor.visit(*static_cast<std::conditional_t<isConst, const IffEventClauseSyntax*, IffEventClauseSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::IffPropertyExpr: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryPropertyExprSyntax*, BinaryPropertyExprSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ImmediateAssertStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const ImmediateAssertionStatementSyntax*, ImmediateAssertionStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ImmediateAssertionMember: return visitor.visit(*static_cast<std::conditional_t<isConst, const ImmediateAssertionMemberSyntax*, ImmediateAssertionMemberSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ImmediateAssumeStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const ImmediateAssertionStatementSyntax*, ImmediateAssertionStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ImmediateCoverStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const ImmediateAssertionStatementSyntax*, ImmediateAssertionStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ImplementsClause: return visitor.visit(*static_cast<std::conditional_t<isConst, const ImplementsClauseSyntax*, ImplementsClauseSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ImplicationConstraint: return visitor.visit(*static_cast<std::conditional_t<isConst, const ImplicationConstraintSyntax*, ImplicationConstraintSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ImplicationPropertyExpr: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryPropertyExprSyntax*, BinaryPropertyExprSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ImplicitAnsiPort: return visitor.visit(*static_cast<std::conditional_t<isConst, const ImplicitAnsiPortSyntax*, ImplicitAnsiPortSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ImplicitEventControl: return visitor.visit(*static_cast<std::conditional_t<isConst, const ImplicitEventControlSyntax*, ImplicitEventControlSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ImplicitNonAnsiPort: return visitor.visit(*static_cast<std::conditional_t<isConst, const ImplicitNonAnsiPortSyntax*, ImplicitNonAnsiPortSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ImplicitType: return visitor.visit(*static_cast<std::conditional_t<isConst, const ImplicitTypeSyntax*, ImplicitTypeSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ImpliesPropertyExpr: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryPropertyExprSyntax*, BinaryPropertyExprSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::IncludeDirective: return visitor.visit(*static_cast<std::conditional_t<isConst, const IncludeDirectiveSyntax*, IncludeDirectiveSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::InequalityExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::InitialBlock: return visitor.visit(*static_cast<std::conditional_t<isConst, const ProceduralBlockSyntax*, ProceduralBlockSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::InsideExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const InsideExpressionSyntax*, InsideExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::InstanceConfigRule: return visitor.visit(*static_cast<std::conditional_t<isConst, const InstanceConfigRuleSyntax*, InstanceConfigRuleSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::InstanceName: return visitor.visit(*static_cast<std::conditional_t<isConst, const InstanceNameSyntax*, InstanceNameSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::IntType: return visitor.visit(*static_cast<std::conditional_t<isConst, const IntegerTypeSyntax*, IntegerTypeSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::IntegerLiteralExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const LiteralExpressionSyntax*, LiteralExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::IntegerType: return visitor.visit(*static_cast<std::conditional_t<isConst, const IntegerTypeSyntax*, IntegerTypeSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::IntegerVectorExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const IntegerVectorExpressionSyntax*, IntegerVectorExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::InterfaceDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const ModuleDeclarationSyntax*, ModuleDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::InterfaceHeader: return visitor.visit(*static_cast<std::conditional_t<isConst, const ModuleHeaderSyntax*, ModuleHeaderSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::InterfacePortHeader: return visitor.visit(*static_cast<std::conditional_t<isConst, const InterfacePortHeaderSyntax*, InterfacePortHeaderSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::IntersectClause: return visitor.visit(*static_cast<std::conditional_t<isConst, const IntersectClauseSyntax*, IntersectClauseSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::IntersectSequenceExpr: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinarySequenceExprSyntax*, BinarySequenceExprSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::InvocationExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const InvocationExpressionSyntax*, InvocationExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::JumpStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const JumpStatementSyntax*, JumpStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::LessThanEqualExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::LessThanExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::LetDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const LetDeclarationSyntax*, LetDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::LibraryDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const LibraryDeclarationSyntax*, LibraryDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::LibraryIncDirClause: return visitor.visit(*static_cast<std::conditional_t<isConst, const LibraryIncDirClauseSyntax*, LibraryIncDirClauseSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::LibraryIncludeStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const LibraryIncludeStatementSyntax*, LibraryIncludeStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::LibraryMap: return visitor.visit(*static_cast<std::conditional_t<isConst, const LibraryMapSyntax*, LibraryMapSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::LineDirective: return visitor.visit(*static_cast<std::conditional_t<isConst, const LineDirectiveSyntax*, LineDirectiveSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::LocalScope: return visitor.visit(*static_cast<std::conditional_t<isConst, const KeywordNameSyntax*, KeywordNameSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::LocalVariableDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const LocalVariableDeclarationSyntax*, LocalVariableDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::LogicType: return visitor.visit(*static_cast<std::conditional_t<isConst, const IntegerTypeSyntax*, IntegerTypeSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::LogicalAndExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::LogicalEquivalenceExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::LogicalImplicationExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::LogicalLeftShiftAssignmentExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::LogicalOrExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::LogicalRightShiftAssignmentExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::LogicalShiftLeftExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::LogicalShiftRightExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::LongIntType: return visitor.visit(*static_cast<std::conditional_t<isConst, const IntegerTypeSyntax*, IntegerTypeSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::LoopConstraint: return visitor.visit(*static_cast<std::conditional_t<isConst, const LoopConstraintSyntax*, LoopConstraintSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::LoopGenerate: return visitor.visit(*static_cast<std::conditional_t<isConst, const LoopGenerateSyntax*, LoopGenerateSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::LoopStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const LoopStatementSyntax*, LoopStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::MacroActualArgument: return visitor.visit(*static_cast<std::conditional_t<isConst, const MacroActualArgumentSyntax*, MacroActualArgumentSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::MacroActualArgumentList: return visitor.visit(*static_cast<std::conditional_t<isConst, const MacroActualArgumentListSyntax*, MacroActualArgumentListSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::MacroArgumentDefault: return visitor.visit(*static_cast<std::conditional_t<isConst, const MacroArgumentDefaultSyntax*, MacroArgumentDefaultSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::MacroFormalArgument: return visitor.visit(*static_cast<std::conditional_t<isConst, const MacroFormalArgumentSyntax*, MacroFormalArgumentSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::MacroFormalArgumentList: return visitor.visit(*static_cast<std::conditional_t<isConst, const MacroFormalArgumentListSyntax*, MacroFormalArgumentListSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::MacroUsage: return visitor.visit(*static_cast<std::conditional_t<isConst, const MacroUsageSyntax*, MacroUsageSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::MatchesClause: return visitor.visit(*static_cast<std::conditional_t<isConst, const MatchesClauseSyntax*, MatchesClauseSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::MemberAccessExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const MemberAccessExpressionSyntax*, MemberAccessExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::MinTypMaxExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const MinTypMaxExpressionSyntax*, MinTypMaxExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ModAssignmentExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ModExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ModportClockingPort: return visitor.visit(*static_cast<std::conditional_t<isConst, const ModportClockingPortSyntax*, ModportClockingPortSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ModportDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const ModportDeclarationSyntax*, ModportDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ModportExplicitPort: return visitor.visit(*static_cast<std::conditional_t<isConst, const ModportExplicitPortSyntax*, ModportExplicitPortSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ModportItem: return visitor.visit(*static_cast<std::conditional_t<isConst, const ModportItemSyntax*, ModportItemSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ModportNamedPort: return visitor.visit(*static_cast<std::conditional_t<isConst, const ModportNamedPortSyntax*, ModportNamedPortSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ModportSimplePortList: return visitor.visit(*static_cast<std::conditional_t<isConst, const ModportSimplePortListSyntax*, ModportSimplePortListSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ModportSubroutinePort: return visitor.visit(*static_cast<std::conditional_t<isConst, const ModportSubroutinePortSyntax*, ModportSubroutinePortSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ModportSubroutinePortList: return visitor.visit(*static_cast<std::conditional_t<isConst, const ModportSubroutinePortListSyntax*, ModportSubroutinePortListSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ModuleDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const ModuleDeclarationSyntax*, ModuleDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ModuleHeader: return visitor.visit(*static_cast<std::conditional_t<isConst, const ModuleHeaderSyntax*, ModuleHeaderSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::MultipleConcatenationExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const MultipleConcatenationExpressionSyntax*, MultipleConcatenationExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::MultiplyAssignmentExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::MultiplyExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::NameValuePragmaExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const NameValuePragmaExpressionSyntax*, NameValuePragmaExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::NamedArgument: return visitor.visit(*static_cast<std::conditional_t<isConst, const NamedArgumentSyntax*, NamedArgumentSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::NamedBlockClause: return visitor.visit(*static_cast<std::conditional_t<isConst, const NamedBlockClauseSyntax*, NamedBlockClauseSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::NamedConditionalDirectiveExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const NamedConditionalDirectiveExpressionSyntax*, NamedConditionalDirectiveExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::NamedLabel: return visitor.visit(*static_cast<std::conditional_t<isConst, const NamedLabelSyntax*, NamedLabelSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::NamedParamAssignment: return visitor.visit(*static_cast<std::conditional_t<isConst, const NamedParamAssignmentSyntax*, NamedParamAssignmentSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::NamedPortConnection: return visitor.visit(*static_cast<std::conditional_t<isConst, const NamedPortConnectionSyntax*, NamedPortConnectionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::NamedStructurePatternMember: return visitor.visit(*static_cast<std::conditional_t<isConst, const NamedStructurePatternMemberSyntax*, NamedStructurePatternMemberSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::NamedType: return visitor.visit(*static_cast<std::conditional_t<isConst, const NamedTypeSyntax*, NamedTypeSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::NetAlias: return visitor.visit(*static_cast<std::conditional_t<isConst, const NetAliasSyntax*, NetAliasSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::NetDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const NetDeclarationSyntax*, NetDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::NetPortHeader: return visitor.visit(*static_cast<std::conditional_t<isConst, const NetPortHeaderSyntax*, NetPortHeaderSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::NetTypeDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const NetTypeDeclarationSyntax*, NetTypeDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::NewArrayExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const NewArrayExpressionSyntax*, NewArrayExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::NewClassExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const NewClassExpressionSyntax*, NewClassExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::NoUnconnectedDriveDirective: return visitor.visit(*static_cast<std::conditional_t<isConst, const SimpleDirectiveSyntax*, SimpleDirectiveSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::NonAnsiPortList: return visitor.visit(*static_cast<std::conditional_t<isConst, const NonAnsiPortListSyntax*, NonAnsiPortListSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::NonAnsiUdpPortList: return visitor.visit(*static_cast<std::conditional_t<isConst, const NonAnsiUdpPortListSyntax*, NonAnsiUdpPortListSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::NonblockingAssignmentExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::NonblockingEventTriggerStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const EventTriggerStatementSyntax*, EventTriggerStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::NullLiteralExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const LiteralExpressionSyntax*, LiteralExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::NumberPragmaExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const NumberPragmaExpressionSyntax*, NumberPragmaExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::OneStepDelay: return visitor.visit(*static_cast<std::conditional_t<isConst, const OneStepDelaySyntax*, OneStepDelaySyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::OrAssignmentExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::OrPropertyExpr: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryPropertyExprSyntax*, BinaryPropertyExprSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::OrSequenceExpr: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinarySequenceExprSyntax*, BinarySequenceExprSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::OrderedArgument: return visitor.visit(*static_cast<std::conditional_t<isConst, const OrderedArgumentSyntax*, OrderedArgumentSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::OrderedParamAssignment: return visitor.visit(*static_cast<std::conditional_t<isConst, const OrderedParamAssignmentSyntax*, OrderedParamAssignmentSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::OrderedPortConnection: return visitor.visit(*static_cast<std::conditional_t<isConst, const OrderedPortConnectionSyntax*, OrderedPortConnectionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::OrderedStructurePatternMember: return visitor.visit(*static_cast<std::conditional_t<isConst, const OrderedStructurePatternMemberSyntax*, OrderedStructurePatternMemberSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::PackageDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const ModuleDeclarationSyntax*, ModuleDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::PackageExportAllDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const PackageExportAllDeclarationSyntax*, PackageExportAllDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::PackageExportDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const PackageExportDeclarationSyntax*, PackageExportDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::PackageHeader: return visitor.visit(*static_cast<std::conditional_t<isConst, const ModuleHeaderSyntax*, ModuleHeaderSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::PackageImportDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const PackageImportDeclarationSyntax*, PackageImportDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::PackageImportItem: return visitor.visit(*static_cast<std::conditional_t<isConst, const PackageImportItemSyntax*, PackageImportItemSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ParallelBlockStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const BlockStatementSyntax*, BlockStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ParameterDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const ParameterDeclarationSyntax*, ParameterDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ParameterDeclarationStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const ParameterDeclarationStatementSyntax*, ParameterDeclarationStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ParameterPortList: return visitor.visit(*static_cast<std::conditional_t<isConst, const ParameterPortListSyntax*, ParameterPortListSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ParameterValueAssignment: return visitor.visit(*static_cast<std::conditional_t<isConst, const ParameterValueAssignmentSyntax*, ParameterValueAssignmentSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ParenExpressionList: return visitor.visit(*static_cast<std::conditional_t<isConst, const ParenExpressionListSyntax*, ParenExpressionListSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ParenPragmaExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const ParenPragmaExpressionSyntax*, ParenPragmaExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ParenthesizedBinsSelectExpr: return visitor.visit(*static_cast<std::conditional_t<isConst, const ParenthesizedBinsSelectExprSyntax*, ParenthesizedBinsSelectExprSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ParenthesizedConditionalDirectiveExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const ParenthesizedConditionalDirectiveExpressionSyntax*, ParenthesizedConditionalDirectiveExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ParenthesizedEventExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const ParenthesizedEventExpressionSyntax*, ParenthesizedEventExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ParenthesizedExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const ParenthesizedExpressionSyntax*, ParenthesizedExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ParenthesizedPattern: return visitor.visit(*static_cast<std::conditional_t<isConst, const ParenthesizedPatternSyntax*, ParenthesizedPatternSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ParenthesizedPropertyExpr: return visitor.visit(*static_cast<std::conditional_t<isConst, const ParenthesizedPropertyExprSyntax*, ParenthesizedPropertyExprSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ParenthesizedSequenceExpr: return visitor.visit(*static_cast<std::conditional_t<isConst, const ParenthesizedSequenceExprSyntax*, ParenthesizedSequenceExprSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::PathDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const PathDeclarationSyntax*, PathDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::PathDescription: return visitor.visit(*static_cast<std::conditional_t<isConst, const PathDescriptionSyntax*, PathDescriptionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::PatternCaseItem: return visitor.visit(*static_cast<std::conditional_t<isConst, const PatternCaseItemSyntax*, PatternCaseItemSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::PortConcatenation: return visitor.visit(*static_cast<std::conditional_t<isConst, const PortConcatenationSyntax*, PortConcatenationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::PortDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const PortDeclarationSyntax*, PortDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::PortReference: return visitor.visit(*static_cast<std::conditional_t<isConst, const PortReferenceSyntax*, PortReferenceSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::PostdecrementExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const PostfixUnaryExpressionSyntax*, PostfixUnaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::PostincrementExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const PostfixUnaryExpressionSyntax*, PostfixUnaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::PowerExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::PragmaDirective: return visitor.visit(*static_cast<std::conditional_t<isConst, const PragmaDirectiveSyntax*, PragmaDirectiveSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::PrimaryBlockEventExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const PrimaryBlockEventExpressionSyntax*, PrimaryBlockEventExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::PrimitiveInstantiation: return visitor.visit(*static_cast<std::conditional_t<isConst, const PrimitiveInstantiationSyntax*, PrimitiveInstantiationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ProceduralAssignStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const ProceduralAssignStatementSyntax*, ProceduralAssignStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ProceduralDeassignStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const ProceduralDeassignStatementSyntax*, ProceduralDeassignStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ProceduralForceStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const ProceduralAssignStatementSyntax*, ProceduralAssignStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ProceduralReleaseStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const ProceduralDeassignStatementSyntax*, ProceduralDeassignStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::Production: return visitor.visit(*static_cast<std::conditional_t<isConst, const ProductionSyntax*, ProductionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ProgramDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const ModuleDeclarationSyntax*, ModuleDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ProgramHeader: return visitor.visit(*static_cast<std::conditional_t<isConst, const ModuleHeaderSyntax*, ModuleHeaderSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::PropertyDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const PropertyDeclarationSyntax*, PropertyDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::PropertySpec: return visitor.visit(*static_cast<std::conditional_t<isConst, const PropertySpecSyntax*, PropertySpecSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::PropertyType: return visitor.visit(*static_cast<std::conditional_t<isConst, const KeywordTypeSyntax*, KeywordTypeSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ProtectDirective: return visitor.visit(*static_cast<std::conditional_t<isConst, const SimpleDirectiveSyntax*, SimpleDirectiveSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ProtectedDirective: return visitor.visit(*static_cast<std::conditional_t<isConst, const SimpleDirectiveSyntax*, SimpleDirectiveSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::PullStrength: return visitor.visit(*static_cast<std::conditional_t<isConst, const PullStrengthSyntax*, PullStrengthSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::PulseStyleDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const PulseStyleDeclarationSyntax*, PulseStyleDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::QueueDimensionSpecifier: return visitor.visit(*static_cast<std::conditional_t<isConst, const QueueDimensionSpecifierSyntax*, QueueDimensionSpecifierSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::RandCaseItem: return visitor.visit(*static_cast<std::conditional_t<isConst, const RandCaseItemSyntax*, RandCaseItemSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::RandCaseStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const RandCaseStatementSyntax*, RandCaseStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::RandJoinClause: return visitor.visit(*static_cast<std::conditional_t<isConst, const RandJoinClauseSyntax*, RandJoinClauseSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::RandSequenceStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const RandSequenceStatementSyntax*, RandSequenceStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::RangeCoverageBinInitializer: return visitor.visit(*static_cast<std::conditional_t<isConst, const RangeCoverageBinInitializerSyntax*, RangeCoverageBinInitializerSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::RangeDimensionSpecifier: return visitor.visit(*static_cast<std::conditional_t<isConst, const RangeDimensionSpecifierSyntax*, RangeDimensionSpecifierSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::RangeList: return visitor.visit(*static_cast<std::conditional_t<isConst, const RangeListSyntax*, RangeListSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::RealLiteralExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const LiteralExpressionSyntax*, LiteralExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::RealTimeType: return visitor.visit(*static_cast<std::conditional_t<isConst, const KeywordTypeSyntax*, KeywordTypeSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::RealType: return visitor.visit(*static_cast<std::conditional_t<isConst, const KeywordTypeSyntax*, KeywordTypeSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::RegType: return visitor.visit(*static_cast<std::conditional_t<isConst, const IntegerTypeSyntax*, IntegerTypeSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::RepeatedEventControl: return visitor.visit(*static_cast<std::conditional_t<isConst, const RepeatedEventControlSyntax*, RepeatedEventControlSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ReplicatedAssignmentPattern: return visitor.visit(*static_cast<std::conditional_t<isConst, const ReplicatedAssignmentPatternSyntax*, ReplicatedAssignmentPatternSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ResetAllDirective: return visitor.visit(*static_cast<std::conditional_t<isConst, const SimpleDirectiveSyntax*, SimpleDirectiveSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::RestrictPropertyStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const ConcurrentAssertionStatementSyntax*, ConcurrentAssertionStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ReturnStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const ReturnStatementSyntax*, ReturnStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::RootScope: return visitor.visit(*static_cast<std::conditional_t<isConst, const KeywordNameSyntax*, KeywordNameSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::RsCase: return visitor.visit(*static_cast<std::conditional_t<isConst, const RsCaseSyntax*, RsCaseSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::RsCodeBlock: return visitor.visit(*static_cast<std::conditional_t<isConst, const RsCodeBlockSyntax*, RsCodeBlockSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::RsElseClause: return visitor.visit(*static_cast<std::conditional_t<isConst, const RsElseClauseSyntax*, RsElseClauseSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::RsIfElse: return visitor.visit(*static_cast<std::conditional_t<isConst, const RsIfElseSyntax*, RsIfElseSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::RsProdItem: return visitor.visit(*static_cast<std::conditional_t<isConst, const RsProdItemSyntax*, RsProdItemSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::RsRepeat: return visitor.visit(*static_cast<std::conditional_t<isConst, const RsRepeatSyntax*, RsRepeatSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::RsRule: return visitor.visit(*static_cast<std::conditional_t<isConst, const RsRuleSyntax*, RsRuleSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::RsWeightClause: return visitor.visit(*static_cast<std::conditional_t<isConst, const RsWeightClauseSyntax*, RsWeightClauseSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::SUntilPropertyExpr: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryPropertyExprSyntax*, BinaryPropertyExprSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::SUntilWithPropertyExpr: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryPropertyExprSyntax*, BinaryPropertyExprSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ScopedName: return visitor.visit(*static_cast<std::conditional_t<isConst, const ScopedNameSyntax*, ScopedNameSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::SequenceDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const SequenceDeclarationSyntax*, SequenceDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::SequenceMatchList: return visitor.visit(*static_cast<std::conditional_t<isConst, const SequenceMatchListSyntax*, SequenceMatchListSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::SequenceRepetition: return visitor.visit(*static_cast<std::conditional_t<isConst, const SequenceRepetitionSyntax*, SequenceRepetitionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::SequenceType: return visitor.visit(*static_cast<std::conditional_t<isConst, const KeywordTypeSyntax*, KeywordTypeSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::SequentialBlockStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const BlockStatementSyntax*, BlockStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ShortIntType: return visitor.visit(*static_cast<std::conditional_t<isConst, const IntegerTypeSyntax*, IntegerTypeSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ShortRealType: return visitor.visit(*static_cast<std::conditional_t<isConst, const KeywordTypeSyntax*, KeywordTypeSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::SignalEventExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const SignalEventExpressionSyntax*, SignalEventExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::SignedCastExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const SignedCastExpressionSyntax*, SignedCastExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::SimpleAssignmentPattern: return visitor.visit(*static_cast<std::conditional_t<isConst, const SimpleAssignmentPatternSyntax*, SimpleAssignmentPatternSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::SimpleBinsSelectExpr: return visitor.visit(*static_cast<std::conditional_t<isConst, const SimpleBinsSelectExprSyntax*, SimpleBinsSelectExprSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::SimplePathSuffix: return visitor.visit(*static_cast<std::conditional_t<isConst, const SimplePathSuffixSyntax*, SimplePathSuffixSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::SimplePragmaExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const SimplePragmaExpressionSyntax*, SimplePragmaExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::SimplePropertyExpr: return visitor.visit(*static_cast<std::conditional_t<isConst, const SimplePropertyExprSyntax*, SimplePropertyExprSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::SimpleRangeSelect: return visitor.visit(*static_cast<std::conditional_t<isConst, const RangeSelectSyntax*, RangeSelectSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::SimpleSequenceExpr: return visitor.visit(*static_cast<std::conditional_t<isConst, const SimpleSequenceExprSyntax*, SimpleSequenceExprSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::SolveBeforeConstraint: return visitor.visit(*static_cast<std::conditional_t<isConst, const SolveBeforeConstraintSyntax*, SolveBeforeConstraintSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::SpecifyBlock: return visitor.visit(*static_cast<std::conditional_t<isConst, const SpecifyBlockSyntax*, SpecifyBlockSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::SpecparamDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const SpecparamDeclarationSyntax*, SpecparamDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::SpecparamDeclarator: return visitor.visit(*static_cast<std::conditional_t<isConst, const SpecparamDeclaratorSyntax*, SpecparamDeclaratorSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::StandardCaseItem: return visitor.visit(*static_cast<std::conditional_t<isConst, const StandardCaseItemSyntax*, StandardCaseItemSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::StandardPropertyCaseItem: return visitor.visit(*static_cast<std::conditional_t<isConst, const StandardPropertyCaseItemSyntax*, StandardPropertyCaseItemSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::StandardRsCaseItem: return visitor.visit(*static_cast<std::conditional_t<isConst, const StandardRsCaseItemSyntax*, StandardRsCaseItemSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::StreamExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const StreamExpressionSyntax*, StreamExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::StreamExpressionWithRange: return visitor.visit(*static_cast<std::conditional_t<isConst, const StreamExpressionWithRangeSyntax*, StreamExpressionWithRangeSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::StreamingConcatenationExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const StreamingConcatenationExpressionSyntax*, StreamingConcatenationExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::StringLiteralExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const LiteralExpressionSyntax*, LiteralExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::StringType: return visitor.visit(*static_cast<std::conditional_t<isConst, const KeywordTypeSyntax*, KeywordTypeSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::StrongWeakPropertyExpr: return visitor.visit(*static_cast<std::conditional_t<isConst, const StrongWeakPropertyExprSyntax*, StrongWeakPropertyExprSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::StructType: return visitor.visit(*static_cast<std::conditional_t<isConst, const StructUnionTypeSyntax*, StructUnionTypeSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::StructUnionMember: return visitor.visit(*static_cast<std::conditional_t<isConst, const StructUnionMemberSyntax*, StructUnionMemberSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::StructurePattern: return visitor.visit(*static_cast<std::conditional_t<isConst, const StructurePatternSyntax*, StructurePatternSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::StructuredAssignmentPattern: return visitor.visit(*static_cast<std::conditional_t<isConst, const StructuredAssignmentPatternSyntax*, StructuredAssignmentPatternSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::SubtractAssignmentExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::SubtractExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::SuperHandle: return visitor.visit(*static_cast<std::conditional_t<isConst, const KeywordNameSyntax*, KeywordNameSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::SuperNewDefaultedArgsExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const SuperNewDefaultedArgsExpressionSyntax*, SuperNewDefaultedArgsExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::SystemName: return visitor.visit(*static_cast<std::conditional_t<isConst, const SystemNameSyntax*, SystemNameSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::SystemTimingCheck: return visitor.visit(*static_cast<std::conditional_t<isConst, const SystemTimingCheckSyntax*, SystemTimingCheckSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::TaggedPattern: return visitor.visit(*static_cast<std::conditional_t<isConst, const TaggedPatternSyntax*, TaggedPatternSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::TaggedUnionExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const TaggedUnionExpressionSyntax*, TaggedUnionExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::TaskDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const FunctionDeclarationSyntax*, FunctionDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ThisHandle: return visitor.visit(*static_cast<std::conditional_t<isConst, const KeywordNameSyntax*, KeywordNameSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ThroughoutSequenceExpr: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinarySequenceExprSyntax*, BinarySequenceExprSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::TimeLiteralExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const LiteralExpressionSyntax*, LiteralExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::TimeScaleDirective: return visitor.visit(*static_cast<std::conditional_t<isConst, const TimeScaleDirectiveSyntax*, TimeScaleDirectiveSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::TimeType: return visitor.visit(*static_cast<std::conditional_t<isConst, const IntegerTypeSyntax*, IntegerTypeSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::TimeUnitsDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const TimeUnitsDeclarationSyntax*, TimeUnitsDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::TimingCheckEventArg: return visitor.visit(*static_cast<std::conditional_t<isConst, const TimingCheckEventArgSyntax*, TimingCheckEventArgSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::TimingCheckEventCondition: return visitor.visit(*static_cast<std::conditional_t<isConst, const TimingCheckEventConditionSyntax*, TimingCheckEventConditionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::TimingControlExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const TimingControlExpressionSyntax*, TimingControlExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::TimingControlStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const TimingControlStatementSyntax*, TimingControlStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::TransListCoverageBinInitializer: return visitor.visit(*static_cast<std::conditional_t<isConst, const TransListCoverageBinInitializerSyntax*, TransListCoverageBinInitializerSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::TransRange: return visitor.visit(*static_cast<std::conditional_t<isConst, const TransRangeSyntax*, TransRangeSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::TransRepeatRange: return visitor.visit(*static_cast<std::conditional_t<isConst, const TransRepeatRangeSyntax*, TransRepeatRangeSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::TransSet: return visitor.visit(*static_cast<std::conditional_t<isConst, const TransSetSyntax*, TransSetSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::TypeAssignment: return visitor.visit(*static_cast<std::conditional_t<isConst, const TypeAssignmentSyntax*, TypeAssignmentSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::TypeParameterDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const TypeParameterDeclarationSyntax*, TypeParameterDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::TypeReference: return visitor.visit(*static_cast<std::conditional_t<isConst, const TypeReferenceSyntax*, TypeReferenceSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::TypedefDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const TypedefDeclarationSyntax*, TypedefDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::UdpBody: return visitor.visit(*static_cast<std::conditional_t<isConst, const UdpBodySyntax*, UdpBodySyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::UdpDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const UdpDeclarationSyntax*, UdpDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::UdpEdgeField: return visitor.visit(*static_cast<std::conditional_t<isConst, const UdpEdgeFieldSyntax*, UdpEdgeFieldSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::UdpEntry: return visitor.visit(*static_cast<std::conditional_t<isConst, const UdpEntrySyntax*, UdpEntrySyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::UdpInitialStmt: return visitor.visit(*static_cast<std::conditional_t<isConst, const UdpInitialStmtSyntax*, UdpInitialStmtSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::UdpInputPortDecl: return visitor.visit(*static_cast<std::conditional_t<isConst, const UdpInputPortDeclSyntax*, UdpInputPortDeclSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::UdpOutputPortDecl: return visitor.visit(*static_cast<std::conditional_t<isConst, const UdpOutputPortDeclSyntax*, UdpOutputPortDeclSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::UdpSimpleField: return visitor.visit(*static_cast<std::conditional_t<isConst, const UdpSimpleFieldSyntax*, UdpSimpleFieldSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::UnaryBinsSelectExpr: return visitor.visit(*static_cast<std::conditional_t<isConst, const UnaryBinsSelectExprSyntax*, UnaryBinsSelectExprSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::UnaryBitwiseAndExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const PrefixUnaryExpressionSyntax*, PrefixUnaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::UnaryBitwiseNandExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const PrefixUnaryExpressionSyntax*, PrefixUnaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::UnaryBitwiseNorExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const PrefixUnaryExpressionSyntax*, PrefixUnaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::UnaryBitwiseNotExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const PrefixUnaryExpressionSyntax*, PrefixUnaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::UnaryBitwiseOrExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const PrefixUnaryExpressionSyntax*, PrefixUnaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::UnaryBitwiseXnorExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const PrefixUnaryExpressionSyntax*, PrefixUnaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::UnaryBitwiseXorExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const PrefixUnaryExpressionSyntax*, PrefixUnaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::UnaryConditionalDirectiveExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const UnaryConditionalDirectiveExpressionSyntax*, UnaryConditionalDirectiveExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::UnaryLogicalNotExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const PrefixUnaryExpressionSyntax*, PrefixUnaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::UnaryMinusExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const PrefixUnaryExpressionSyntax*, PrefixUnaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::UnaryPlusExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const PrefixUnaryExpressionSyntax*, PrefixUnaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::UnaryPredecrementExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const PrefixUnaryExpressionSyntax*, PrefixUnaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::UnaryPreincrementExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const PrefixUnaryExpressionSyntax*, PrefixUnaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::UnaryPropertyExpr: return visitor.visit(*static_cast<std::conditional_t<isConst, const UnaryPropertyExprSyntax*, UnaryPropertyExprSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::UnarySelectPropertyExpr: return visitor.visit(*static_cast<std::conditional_t<isConst, const UnarySelectPropertyExprSyntax*, UnarySelectPropertyExprSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::UnbasedUnsizedLiteralExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const LiteralExpressionSyntax*, LiteralExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::UnconnectedDriveDirective: return visitor.visit(*static_cast<std::conditional_t<isConst, const UnconnectedDriveDirectiveSyntax*, UnconnectedDriveDirectiveSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::UndefDirective: return visitor.visit(*static_cast<std::conditional_t<isConst, const UndefDirectiveSyntax*, UndefDirectiveSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::UndefineAllDirective: return visitor.visit(*static_cast<std::conditional_t<isConst, const SimpleDirectiveSyntax*, SimpleDirectiveSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::UnionType: return visitor.visit(*static_cast<std::conditional_t<isConst, const StructUnionTypeSyntax*, StructUnionTypeSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::UniquenessConstraint: return visitor.visit(*static_cast<std::conditional_t<isConst, const UniquenessConstraintSyntax*, UniquenessConstraintSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::UnitScope: return visitor.visit(*static_cast<std::conditional_t<isConst, const KeywordNameSyntax*, KeywordNameSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::UntilPropertyExpr: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryPropertyExprSyntax*, BinaryPropertyExprSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::UntilWithPropertyExpr: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryPropertyExprSyntax*, BinaryPropertyExprSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::Untyped: return visitor.visit(*static_cast<std::conditional_t<isConst, const KeywordTypeSyntax*, KeywordTypeSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::UserDefinedNetDeclaration: return visitor.visit(*static_cast<std::conditional_t<isConst, const UserDefinedNetDeclarationSyntax*, UserDefinedNetDeclarationSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::ValueRangeExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const ValueRangeExpressionSyntax*, ValueRangeExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::VariableDimension: return visitor.visit(*static_cast<std::conditional_t<isConst, const VariableDimensionSyntax*, VariableDimensionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::VariablePattern: return visitor.visit(*static_cast<std::conditional_t<isConst, const VariablePatternSyntax*, VariablePatternSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::VariablePortHeader: return visitor.visit(*static_cast<std::conditional_t<isConst, const VariablePortHeaderSyntax*, VariablePortHeaderSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::VirtualInterfaceType: return visitor.visit(*static_cast<std::conditional_t<isConst, const VirtualInterfaceTypeSyntax*, VirtualInterfaceTypeSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::VoidCastedCallStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const VoidCastedCallStatementSyntax*, VoidCastedCallStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::VoidType: return visitor.visit(*static_cast<std::conditional_t<isConst, const KeywordTypeSyntax*, KeywordTypeSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::WaitForkStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const WaitForkStatementSyntax*, WaitForkStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::WaitOrderStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const WaitOrderStatementSyntax*, WaitOrderStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::WaitStatement: return visitor.visit(*static_cast<std::conditional_t<isConst, const WaitStatementSyntax*, WaitStatementSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::WildcardDimensionSpecifier: return visitor.visit(*static_cast<std::conditional_t<isConst, const WildcardDimensionSpecifierSyntax*, WildcardDimensionSpecifierSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::WildcardEqualityExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::WildcardInequalityExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::WildcardLiteralExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const LiteralExpressionSyntax*, LiteralExpressionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::WildcardPattern: return visitor.visit(*static_cast<std::conditional_t<isConst, const WildcardPatternSyntax*, WildcardPatternSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::WildcardPortConnection: return visitor.visit(*static_cast<std::conditional_t<isConst, const WildcardPortConnectionSyntax*, WildcardPortConnectionSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::WildcardPortList: return visitor.visit(*static_cast<std::conditional_t<isConst, const WildcardPortListSyntax*, WildcardPortListSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::WildcardUdpPortList: return visitor.visit(*static_cast<std::conditional_t<isConst, const WildcardUdpPortListSyntax*, WildcardUdpPortListSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::WithClause: return visitor.visit(*static_cast<std::conditional_t<isConst, const WithClauseSyntax*, WithClauseSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::WithFunctionClause: return visitor.visit(*static_cast<std::conditional_t<isConst, const WithFunctionClauseSyntax*, WithFunctionClauseSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::WithFunctionSample: return visitor.visit(*static_cast<std::conditional_t<isConst, const WithFunctionSampleSyntax*, WithFunctionSampleSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::WithinSequenceExpr: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinarySequenceExprSyntax*, BinarySequenceExprSyntax*>>(node), std::forward<Args>(args)...);
        case SyntaxKind::XorAssignmentExpression: return visitor.visit(*static_cast<std::conditional_t<isConst, const BinaryExpressionSyntax*, BinaryExpressionSyntax*>>(node), std::forward<Args>(args)...);
    }
    SLANG_UNREACHABLE;
}